

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposer.h
# Opt level: O2

Link __thiscall
FixedDegreeProposer::random_new_link(FixedDegreeProposer *this,Network *network,Link old_link)

{
  pointer psVar1;
  uint uVar2;
  size_type sVar3;
  Link new_link;
  Link local_28;
  
  psVar1 = (network->links).
           super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_28 = old_link;
  while( true ) {
    sVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                      (psVar1 + ((ulong)old_link & 0xffffffff),&local_28.second);
    if ((sVar3 == 0) && (local_28.second != local_28.first)) break;
    uVar2 = Random::R(this->rng,0,
                      (uint)((ulong)((long)(network->node_list).
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(network->node_list).
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2));
    local_28.second = uVar2;
  }
  return local_28;
}

Assistant:

Link random_new_link(Network const& network, Link old_link) const {
        Link new_link(old_link);

        std::set<unsigned int> const& list = network.get_links(new_link.first);
        while (list.count(new_link.second) != 0 or new_link.second == new_link.first) {
            new_link.second = rng.R(0, network.getN());
        }

        return new_link;
    }